

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v9::detail::
         write_significand<char,fmt::v9::appender,unsigned_long,fmt::v9::detail::digit_grouping<char>>
                   (appender out,unsigned_long significand,int significand_size,int exponent,
                   digit_grouping<char> *grouping)

{
  basic_string_view<char> digits;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar1;
  appender out_00;
  format_decimal_result<char_*> fVar2;
  char buffer_1 [20];
  char buffer [20];
  char local_258 [32];
  undefined **local_238;
  char *local_230;
  size_t sStack_228;
  ulong local_220;
  char local_218 [504];
  
  if ((grouping->sep_).thousands_sep == '\0') {
    fVar2 = format_decimal<char,unsigned_long>((char *)&local_238,significand,significand_size);
    out_00 = copy_str_noinline<char,char*,fmt::v9::appender>((char *)&local_238,fVar2.end,out);
    local_238 = (undefined **)CONCAT71(local_238._1_7_,0x30);
    bVar1.container =
         (buffer<char> *)fill_n<fmt::v9::appender,int,char>(out_00,exponent,(char *)&local_238);
  }
  else {
    sStack_228 = 0;
    local_238 = &PTR_grow_00149310;
    local_220 = 500;
    local_230 = local_218;
    fVar2 = format_decimal<char,unsigned_long>(local_258,significand,significand_size);
    copy_str_noinline<char,char*,fmt::v9::appender>(local_258,fVar2.end,(appender)&local_238);
    local_258[0] = '0';
    fill_n<fmt::v9::appender,int,char>((appender)&local_238,exponent,local_258);
    digits.size_ = sStack_228;
    digits.data_ = local_230;
    bVar1.container =
         (buffer<char> *)digit_grouping<char>::apply<fmt::v9::appender,char>(grouping,out,digits);
    if (local_230 != local_218) {
      operator_delete(local_230,local_220);
    }
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int exponent,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}